

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O1

newtRef NcLexicalLookup(newtRefArg start,newtRef name)

{
  bool bVar1;
  _Bool _Var2;
  newtRef nVar3;
  newtObjRef obj;
  
  bVar1 = NewtRefIsNIL(start);
  while( true ) {
    if (bVar1) {
      return 0xfff2;
    }
    nVar3 = NcResolveMagicPointer(start);
    if ((~(uint)nVar3 & 3) == 0) break;
    _Var2 = NewtHasSlot(nVar3,name);
    obj = (newtObjRef)(nVar3 - 1);
    if (_Var2) {
      if (obj == (newtObjRef)0x0) {
        return 0xfff2;
      }
      nVar3 = NewtObjGetSlot(obj,name);
      nVar3 = NcResolveMagicPointer(nVar3);
      return nVar3;
    }
    if (obj == (newtObjRef)0x0) {
      start = 0xfff2;
    }
    else {
      nVar3 = NewtObjGetSlot(obj,newt_sym._nextArgFrame);
      start = NcResolveMagicPointer(nVar3);
    }
    bVar1 = NewtRefIsNIL(start);
  }
  return 0xfff2;
}

Assistant:

newtRef NcLexicalLookup(newtRefArg start, newtRef name)
{
    newtRefVar	current = start;
    
    while (NewtRefIsNotNIL(current))
    {
        current = NcResolveMagicPointer(current);
        
        if (NewtRefIsMagicPointer(current))
            return kNewtRefUnbind;
        
        if (NewtHasSlot(current, name))
            return NcGetSlot(current, name);
        
        current = NcGetSlot(current, NSSYM0(_nextArgFrame));
    }
    
    return kNewtRefUnbind;
}